

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_private.c
# Opt level: O3

nhr_bool nhr_request_create_start_work_thread(nhr_request r)

{
  nhr_thread pnVar1;
  
  nhr_mutex_lock(r->command_mutex);
  r->command = 0;
  nhr_mutex_unlock(r->command_mutex);
  pnVar1 = nhr_thread_create(nhr_request_work_th_func,r);
  r->work_thread = pnVar1;
  if (pnVar1 != (nhr_thread)0x0) {
    nhr_mutex_lock(r->command_mutex);
    r->command = 1;
    nhr_mutex_unlock(r->command_mutex);
  }
  return pnVar1 != (nhr_thread)0x0;
}

Assistant:

nhr_bool nhr_request_create_start_work_thread(nhr_request r) {
	nhr_request_set_command(r, NHR_COMMAND_NONE);
	r->work_thread = nhr_thread_create(&nhr_request_work_th_func, r);
	if (r->work_thread) {
		nhr_request_set_command(r, NHR_COMMAND_CONNECT_TO_HOST);
		return nhr_true;
	}
	return nhr_false;
}